

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O3

void flow::lang::completeDefaultValue
               (ParamList *args,LiteralType type,DefaultValue *dv,string *name)

{
  pointer pcVar1;
  uint uVar2;
  undefined8 uVar3;
  variant_alternative_t<1UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *pvVar4;
  variant_alternative_t<5UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *pvVar5;
  LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pLVar6;
  variant_alternative_t<2UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *value;
  variant_alternative_t<4UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *pvVar7;
  variant_alternative_t<3UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *pvVar8;
  undefined8 extraout_RAX;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  byte bVar11;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_28;
  
  bVar11 = 0;
  if (completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
      ::loc == '\0') {
    completeDefaultValue();
  }
  switch(type) {
  case Boolean:
    pvVar4 = std::
             get<1ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    pLVar6 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x48);
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
    (pLVar6->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
         (pointer)&(pLVar6->super_Expr).super_ASTNode.location_.filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pLVar6->super_Expr).super_ASTNode.location_,
               completeDefaultValue::loc.filename._M_dataplus._M_p,
               completeDefaultValue::loc.filename._M_dataplus._M_p +
               completeDefaultValue::loc.filename._M_string_length);
    uVar2 = completeDefaultValue::loc.end.offset;
    (pLVar6->super_Expr).super_ASTNode.location_.end.column = completeDefaultValue::loc.end.column;
    uVar3 = completeDefaultValue::loc._40_8_;
    (pLVar6->super_Expr).super_ASTNode.location_.end.offset = uVar2;
    uVar2 = completeDefaultValue::loc.begin.column;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.line = completeDefaultValue::loc.begin.line;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.column = uVar2;
    *(undefined8 *)&(pLVar6->super_Expr).super_ASTNode.location_.begin.offset = uVar3;
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae930;
    *(variant_alternative_t<1UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
      *)&(pLVar6->value_)._M_dataplus._M_p = *pvVar4;
    local_28._M_head_impl = (Expr *)pLVar6;
    if (args->isNamed_ == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args->names_,name);
    }
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&args->values_,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_28);
    break;
  case Number:
    pvVar8 = std::
             get<3ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    pLVar6 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x48);
    pcVar1 = (pointer)*pvVar8;
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
    (pLVar6->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
         (pointer)&(pLVar6->super_Expr).super_ASTNode.location_.filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pLVar6->super_Expr).super_ASTNode.location_,
               completeDefaultValue::loc.filename._M_dataplus._M_p,
               completeDefaultValue::loc.filename._M_dataplus._M_p +
               completeDefaultValue::loc.filename._M_string_length);
    uVar2 = completeDefaultValue::loc.end.offset;
    (pLVar6->super_Expr).super_ASTNode.location_.end.column = completeDefaultValue::loc.end.column;
    uVar3 = completeDefaultValue::loc._40_8_;
    (pLVar6->super_Expr).super_ASTNode.location_.end.offset = uVar2;
    uVar2 = completeDefaultValue::loc.begin.column;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.line = completeDefaultValue::loc.begin.line;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.column = uVar2;
    *(undefined8 *)&(pLVar6->super_Expr).super_ASTNode.location_.begin.offset = uVar3;
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae8e8;
    (pLVar6->value_)._M_dataplus._M_p = pcVar1;
    local_28._M_head_impl = (Expr *)pLVar6;
    if (args->isNamed_ == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args->names_,name);
    }
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&args->values_,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_28);
    break;
  case String:
    value = std::
            get<2ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                      (dv);
    pLVar6 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x60);
    LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    LiteralExpr(pLVar6,value,&completeDefaultValue::loc);
    local_28._M_head_impl = (Expr *)pLVar6;
    if (args->isNamed_ == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args->names_,name);
    }
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&args->values_,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_28);
    break;
  default:
    completeDefaultValue();
    operator_delete(dv,0x48);
    _Unwind_Resume(extraout_RAX);
  case IPAddress:
    pvVar7 = std::
             get<4ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    pLVar6 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x88);
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
    (pLVar6->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
         (pointer)&(pLVar6->super_Expr).super_ASTNode.location_.filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pLVar6->super_Expr).super_ASTNode.location_,
               completeDefaultValue::loc.filename._M_dataplus._M_p,
               completeDefaultValue::loc.filename._M_dataplus._M_p +
               completeDefaultValue::loc.filename._M_string_length);
    uVar2 = completeDefaultValue::loc.end.offset;
    (pLVar6->super_Expr).super_ASTNode.location_.end.column = completeDefaultValue::loc.end.column;
    uVar3 = completeDefaultValue::loc._40_8_;
    (pLVar6->super_Expr).super_ASTNode.location_.end.offset = uVar2;
    uVar2 = completeDefaultValue::loc.begin.column;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.line = completeDefaultValue::loc.begin.line;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.column = uVar2;
    *(undefined8 *)&(pLVar6->super_Expr).super_ASTNode.location_.begin.offset = uVar3;
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae9a8;
    pbVar10 = &pLVar6->value_;
    for (lVar9 = 0x11; lVar9 != 0; lVar9 = lVar9 + -1) {
      *(Family *)&(pbVar10->_M_dataplus)._M_p = pvVar7->family_;
      pvVar7 = (variant_alternative_t<4UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
                *)((long)pvVar7 + (ulong)bVar11 * -8 + 4);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)pbVar10 + (ulong)bVar11 * -8 + 4);
    }
    local_28._M_head_impl = (Expr *)pLVar6;
    if (args->isNamed_ == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args->names_,name);
    }
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&args->values_,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_28);
    break;
  case Cidr:
    pvVar5 = std::
             get<5ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    pLVar6 = (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x90);
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
    (pLVar6->super_Expr).super_ASTNode.location_.filename._M_dataplus._M_p =
         (pointer)&(pLVar6->super_Expr).super_ASTNode.location_.filename.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pLVar6->super_Expr).super_ASTNode.location_,
               completeDefaultValue::loc.filename._M_dataplus._M_p,
               completeDefaultValue::loc.filename._M_dataplus._M_p +
               completeDefaultValue::loc.filename._M_string_length);
    uVar2 = completeDefaultValue::loc.end.offset;
    (pLVar6->super_Expr).super_ASTNode.location_.end.column = completeDefaultValue::loc.end.column;
    uVar3 = completeDefaultValue::loc._40_8_;
    (pLVar6->super_Expr).super_ASTNode.location_.end.offset = uVar2;
    uVar2 = completeDefaultValue::loc.begin.column;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.line = completeDefaultValue::loc.begin.line;
    (pLVar6->super_Expr).super_ASTNode.location_.begin.column = uVar2;
    *(undefined8 *)&(pLVar6->super_Expr).super_ASTNode.location_.begin.offset = uVar3;
    (pLVar6->super_Expr).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae9f0;
    pbVar10 = &pLVar6->value_;
    for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pbVar10->_M_dataplus)._M_p = *(pointer *)&pvVar5->ipaddr_;
      pvVar5 = (variant_alternative_t<5UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
                *)((long)pvVar5 + (ulong)bVar11 * -0x10 + 8);
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)pbVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    local_28._M_head_impl = (Expr *)pLVar6;
    if (args->isNamed_ == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args->names_,name);
    }
    std::
    vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
    ::emplace_back<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
              ((vector<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::allocator<std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>>
                *)&args->values_,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_28);
  }
  if ((LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)local_28._M_head_impl !=
      (LiteralExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    (*((ASTNode *)&((local_28._M_head_impl)->super_ASTNode)._vptr_ASTNode)->_vptr_ASTNode[1])();
  }
  return;
}

Assistant:

static inline void completeDefaultValue(
    ParamList& args,
    LiteralType type,
    const NativeCallback::DefaultValue& dv,
    const std::string& name) { // {{{
  // printf("completeDefaultValue(type:%s, name:%s)\n", tos(type).c_str(),
  // name.c_str());

  static const SourceLocation loc;

  switch (type) {
    case LiteralType::Boolean:
      args.push_back(
          name,
          std::make_unique<BoolExpr>(std::get<bool>(dv), loc));
      break;
    case LiteralType::Number:
      args.push_back(
          name,
          std::make_unique<NumberExpr>(std::get<FlowNumber>(dv), loc));
      break;
    case LiteralType::String:
      args.push_back(
          name,
          std::make_unique<StringExpr>(std::get<FlowString>(dv), loc));
      break;
    case LiteralType::IPAddress:
      args.push_back(
          name,
          std::make_unique<IPAddressExpr>(std::get<util::IPAddress>(dv), loc));
      break;
    case LiteralType::Cidr:
      args.push_back(
          name,
          std::make_unique<CidrExpr>(std::get<util::Cidr>(dv), loc));
      break;
    default:
      fprintf(stderr, "Unsupported type in default completion. Please report me. I am a bug.");
      abort();
      // reportError("Cannot complete named paramter \"%s\" in callee \"%s\".
      // Unsupported type <%s>.",
      //        name.c_str(), this->name().c_str(), tos(type).c_str());
      break;
  }
}